

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<vkb::SystemInfo> * vkb::SystemInfo::get_system_info(void)

{
  bool bVar1;
  Result<vkb::SystemInfo> *in_RDI;
  SystemInfo local_48;
  
  bVar1 = detail::VulkanFunctions::init_vulkan_funcs
                    ((VulkanFunctions *)detail::vulkan_functions()::v,(PFN_vkGetInstanceProcAddr)0x0
                    );
  if (bVar1) {
    SystemInfo(&local_48);
    (in_RDI->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_start;
    (in_RDI->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (in_RDI->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.available_layers.
         super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (in_RDI->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_start;
    (in_RDI->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (in_RDI->field_0).m_value.available_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&in_RDI->field_0 + 0x30) = local_48._48_8_;
    in_RDI->m_init = true;
  }
  else {
    (in_RDI->field_0).m_error.type._M_value = 0;
    (in_RDI->field_0).m_value.available_layers.
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::instance_error_category;
    (in_RDI->field_0).m_error.vk_result = VK_SUCCESS;
    in_RDI->m_init = false;
  }
  return in_RDI;
}

Assistant:

Result<SystemInfo> SystemInfo::get_system_info() {
    if (!detail::vulkan_functions().init_vulkan_funcs(nullptr)) {
        return make_error_code(InstanceError::vulkan_unavailable);
    }
    return SystemInfo();
}